

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void uv__run_pending(uv_loop_t *loop)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  void **ppvVar4;
  long *local_28;
  void *local_20;
  
  local_28 = (long *)&local_28;
  plVar1 = (long *)loop->pending_queue[0];
  if (loop->pending_queue == (void **)plVar1) {
    ppvVar4 = &local_20;
  }
  else {
    local_20 = loop->pending_queue[1];
    *(long ***)local_20 = &local_28;
    plVar2 = (long *)plVar1[1];
    ppvVar4 = (void **)(plVar1 + 1);
    loop->pending_queue[1] = plVar2;
    *plVar2 = (long)loop->pending_queue;
    local_28 = plVar1;
  }
  *ppvVar4 = &local_28;
  while (plVar1 = local_28, &local_28 != (long **)local_28) {
    lVar3 = *local_28;
    *(long *)local_28[1] = lVar3;
    *(long *)(lVar3 + 8) = local_28[1];
    *local_28 = (long)local_28;
    plVar1[1] = (long)plVar1;
    (*(code *)plVar1[-1])(loop,plVar1 + -1,4);
  }
  return;
}

Assistant:

static void uv__run_pending(uv_loop_t* loop) {
  QUEUE* q;
  QUEUE pq;
  uv__io_t* w;

  QUEUE_MOVE(&loop->pending_queue, &pq);

  while (!QUEUE_EMPTY(&pq)) {
    q = QUEUE_HEAD(&pq);
    QUEUE_REMOVE(q);
    QUEUE_INIT(q);
    w = QUEUE_DATA(q, uv__io_t, pending_queue);
    w->cb(loop, w, POLLOUT);
  }
}